

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodePolygonalFaces(ObjEncoder *this)

{
  _Rb_tree_color _Var1;
  mapped_type *pmVar2;
  FaceIndex fi;
  FaceIndex face_id;
  PointIndex vert_index;
  char local_95;
  AttributeValueIndex position_index;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> corner_table;
  PolygonEdges polygon_edges;
  vector<bool,_std::allocator<bool>_> triangle_visited;
  
  polygon_edges._M_t._M_impl._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&triangle_visited,
             ((long)(this->in_mesh_->faces_).vector_.
                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->in_mesh_->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff,
             (bool *)&polygon_edges,(allocator_type *)&corner_table);
  polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header;
  polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  polygon_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateCornerTableFromPositionAttribute((draco *)&corner_table,this->in_mesh_);
  for (face_id.value_ = 0;
      face_id.value_ <
      (uint)(((long)(this->in_mesh_->faces_).vector_.
                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->in_mesh_->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      face_id.value_ = face_id.value_ + 1) {
    EncodeFaceAttributes(this,face_id);
    std::
    _Rb_tree<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::_Select1st<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
    ::clear(&polygon_edges._M_t);
    FindOriginalFaceEdges
              (this,face_id,
               (CornerTable *)
               corner_table._M_t.
               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,&triangle_visited,
               (PolygonEdges *)&polygon_edges._M_t);
    if (polygon_edges._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      _Var1 = polygon_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      local_95 = 'f';
      position_index.value_ = _Var1;
      EncoderBuffer::Encode<char>(this->out_buffer_,&local_95);
      do {
        pmVar2 = std::
                 map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                 ::operator[]((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                               *)&polygon_edges._M_t,&position_index);
        vert_index.value_ = pmVar2->value_;
        EncodeFaceCorner(this,vert_index);
        if (this->pos_att_->identity_mapping_ == false) {
          vert_index.value_ =
               (this->pos_att_->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
        }
        position_index.value_ = vert_index.value_;
      } while (vert_index.value_ != _Var1);
      EncoderBuffer::Encode(this->out_buffer_,"\n",1);
    }
  }
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            (&corner_table);
  std::
  _Rb_tree<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::_Select1st<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::~_Rb_tree(&polygon_edges._M_t);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&triangle_visited.super__Bvector_base<std::allocator<bool>_>);
  return true;
}

Assistant:

bool ObjEncoder::EncodePolygonalFaces() {
  // TODO(vytyaz): This could be a much smaller set of visited face indices.
  std::vector<bool> triangle_visited(in_mesh_->num_faces(), false);
  PolygonEdges polygon_edges;
  std::unique_ptr<CornerTable> corner_table =
      CreateCornerTableFromPositionAttribute(in_mesh_);
  for (FaceIndex fi(0); fi < in_mesh_->num_faces(); ++fi) {
    EncodeFaceAttributes(fi);
    // Reconstruct polygon from the added edges attribute if available.
    polygon_edges.clear();
    FindOriginalFaceEdges(fi, *corner_table, &triangle_visited, &polygon_edges);

    // Polygon edges could be empty if this triangle has been visited as part
    // of a polygon discovery that started from an earler face.
    if (polygon_edges.empty()) {
      continue;
    }

    // Traverse a polygon by following its edges. The starting point is not
    // guaranteed to be the same as in the original polygon. It is
    // deterministic, however, and defined by std::map behavior.
    const AttributeValueIndex first_position_index =
        polygon_edges.begin()->first;
    AttributeValueIndex position_index = first_position_index;
    buffer()->Encode('f');
    do {
      // Get the next polygon point index by following polygon edge.
      const PointIndex pi = polygon_edges[position_index];
      EncodeFaceCorner(pi);
      position_index = pos_att_->mapped_index(pi).value();
    } while (position_index != first_position_index);
    buffer()->Encode("\n", 1);
  }
  return true;
}